

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

void absl::debugging_internal::MaybeAppendWithLength(State *state,char *str,int length)

{
  bool bVar1;
  int length_local;
  char *str_local;
  State *state_local;
  
  if ((*(int *)&(state->parse_state).field_0xc < 0) && (0 < length)) {
    if ((*str == '<') && (bVar1 = EndsWith(state,'<'), bVar1)) {
      Append(state," ",1);
    }
    if (((state->parse_state).out_cur_idx < state->out_end_idx) &&
       ((bVar1 = IsAlpha(*str), bVar1 || (*str == '_')))) {
      (state->parse_state).prev_name_idx = (state->parse_state).out_cur_idx;
      *(uint *)&(state->parse_state).field_0xc =
           *(uint *)&(state->parse_state).field_0xc & 0xffff0000 | length & 0xffffU;
    }
    Append(state,str,length);
  }
  return;
}

Assistant:

static void MaybeAppendWithLength(State *state, const char *const str,
                                  const int length) {
  if (state->parse_state.append && length > 0) {
    // Append a space if the output buffer ends with '<' and "str"
    // starts with '<' to avoid <<<.
    if (str[0] == '<' && EndsWith(state, '<')) {
      Append(state, " ", 1);
    }
    // Remember the last identifier name for ctors/dtors,
    // but only if we haven't yet overflown the buffer.
    if (state->parse_state.out_cur_idx < state->out_end_idx &&
        (IsAlpha(str[0]) || str[0] == '_')) {
      state->parse_state.prev_name_idx = state->parse_state.out_cur_idx;
      state->parse_state.prev_name_length = length;
    }
    Append(state, str, length);
  }
}